

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createLogicOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  INode *pIVar1;
  size_type sVar2;
  const_reference ppIVar3;
  int in_EDX;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_RSI;
  size_t i;
  LogicExpression *expression;
  Operator mmlOp;
  LogicExpression *in_stack_ffffffffffffffa0;
  INode *pIVar4;
  ulong local_40;
  uint local_20;
  
  if (in_EDX == 5) {
    local_20 = 0;
  }
  else if (in_EDX == 6) {
    local_20 = 1;
  }
  else {
    if (in_EDX != 7) {
      return (INode *)0x0;
    }
    local_20 = 2;
  }
  pIVar1 = (INode *)operator_new(0x28);
  MathML::AST::LogicExpression::LogicExpression(in_stack_ffffffffffffffa0);
  (*pIVar1->_vptr_INode[6])(pIVar1,(ulong)local_20);
  for (local_40 = 0;
      sVar2 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size(in_RSI)
      , local_40 < sVar2; local_40 = local_40 + 1) {
    pIVar4 = pIVar1;
    ppIVar3 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::operator[]
                        (in_RSI,local_40);
    (*pIVar4->_vptr_INode[0xb])(pIVar4,*ppIVar3);
  }
  return pIVar1;
}

Assistant:

MathML::AST::INode* FormulasLoader::createLogicOperation( const NodeVector& nodes, Operator op )
	{
		MathML::AST::LogicExpression::Operator mmlOp;
		switch ( op )
		{
		case AND:
			mmlOp = MathML::AST::LogicExpression::AND;
			break;
		case OR:
			mmlOp = MathML::AST::LogicExpression::OR;
			break;
		case XOR:
			mmlOp = MathML::AST::LogicExpression::XOR;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::LogicExpression* expression = new MathML::AST::LogicExpression();
		expression->setOperator( mmlOp );
		for (size_t i=0; i<nodes.size(); ++i)
		{
			expression->addOperand( nodes[ i ] );
		}

		return expression;
	}